

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_algorithm_deflate.c
# Opt level: O0

_Bool input(void *ud,zip_uint8_t *data,zip_uint64_t length)

{
  int iVar1;
  zip_buffer_t *buffer_00;
  ulong local_48;
  zip_buffer_t *buffer;
  Bytef empty_buffer [1];
  undefined8 *puStack_30;
  zip_uint8_t got;
  ctx_conflict *ctx;
  zip_uint64_t length_local;
  zip_uint8_t *data_local;
  void *ud_local;
  
  puStack_30 = (undefined8 *)ud;
  if ((0xffffffff < length) || (*(long *)((long)ud + 0x20) != 0)) {
    zip_error_set(*ud,0x12,0);
    return false;
  }
  ctx = (ctx_conflict *)length;
  length_local = (zip_uint64_t)data;
  if (((*(short *)((long)ud + 0xa0) == 0xe) && ((*(byte *)((long)ud + 8) & 1) == 0)) &&
     (*(int *)((long)ud + 0xb4) == 0)) {
    local_48 = length;
    if ((ulong)(long)(int)(9 - (uint)*(byte *)((long)ud + 0xb3)) < length) {
      local_48 = (ulong)(int)(9 - (uint)*(byte *)((long)ud + 0xb3));
    }
    buffer._7_1_ = (byte)local_48;
    memcpy((void *)((long)ud + (long)(int)(uint)*(byte *)((long)ud + 0xb3) + 0xa2),data,
           local_48 & 0xff);
    *(byte *)((long)puStack_30 + 0xb3) = *(char *)((long)puStack_30 + 0xb3) + buffer._7_1_;
    ctx = (ctx_conflict *)(length - buffer._7_1_);
    length_local = (zip_uint64_t)(data + (int)(uint)buffer._7_1_);
    if (*(char *)((long)puStack_30 + 0xb3) == '\t') {
      if ((*(char *)((long)puStack_30 + 0xa4) != '\x05') ||
         (*(char *)((long)puStack_30 + 0xa5) != '\0')) {
        zip_error_set((zip_error_t *)*puStack_30,0x1f,0);
        return false;
      }
      buffer_00 = _zip_buffer_new((zip_uint8_t *)((long)puStack_30 + 0xab),8);
      if (buffer_00 == (zip_buffer_t *)0x0) {
        zip_error_set((zip_error_t *)*puStack_30,0xe,0);
        return false;
      }
      _zip_buffer_put_64(buffer_00,puStack_30[0x17]);
      _zip_buffer_free(buffer_00);
      puStack_30[3] = (long)puStack_30 + 0xa6;
      puStack_30[4] = 0xd;
      puStack_30[5] = 0;
      puStack_30[6] = (long)&buffer + 6;
      puStack_30[7] = 1;
      puStack_30[8] = 0;
      iVar1 = lzma_code(puStack_30 + 3,0);
      if ((iVar1 != 0) || (puStack_30[8] != 0)) {
        zip_error_set((zip_error_t *)*puStack_30,0x1f,0);
        return false;
      }
      *(undefined4 *)((long)puStack_30 + 0xb4) = 2;
    }
  }
  puStack_30[4] = (ulong)ctx & 0xffffffff;
  puStack_30[3] = length_local;
  return true;
}

Assistant:

static bool
input(void *ud, zip_uint8_t *data, zip_uint64_t length) {
    struct ctx *ctx = (struct ctx *)ud;

    if (length > UINT_MAX || ctx->zstr.avail_in > 0) {
        zip_error_set(ctx->error, ZIP_ER_INVAL, 0);
        return false;
    }

    ctx->zstr.avail_in = (uInt)length;
    ctx->zstr.next_in = (Bytef *)data;

    return true;
}